

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_promise_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  JSPromiseReactionData *rd;
  long lVar5;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x2a)) &&
     (lVar1 = *(long *)((long)val.u.ptr + 0x30), lVar1 != 0)) {
    lVar3 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      for (lVar5 = *(long *)(lVar1 + 0x10 + lVar3 * 0x10); lVar5 != lVar1 + 8 + lVar3 * 0x10;
          lVar5 = *(long *)(lVar5 + 8)) {
        if ((*(uint *)(lVar5 + 0x18) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar5 + 0x10));
        }
        if ((*(uint *)(lVar5 + 0x28) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar5 + 0x20));
        }
        if ((*(uint *)(lVar5 + 0x38) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar5 + 0x30));
        }
      }
      lVar3 = 1;
      bVar2 = false;
    } while (bVar4);
    if ((*(uint *)(lVar1 + 0x38) & 0xfffffffe) == 0xfffffffe) {
      (*mark_func)(rt,*(JSGCObjectHeader **)(lVar1 + 0x30));
      return;
    }
  }
  return;
}

Assistant:

static void js_promise_mark(JSRuntime *rt, JSValueConst val,
                            JS_MarkFunc *mark_func)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each(el, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            JS_MarkValue(rt, rd->resolving_funcs[0], mark_func);
            JS_MarkValue(rt, rd->resolving_funcs[1], mark_func);
            JS_MarkValue(rt, rd->handler, mark_func);
        }
    }
    JS_MarkValue(rt, s->promise_result, mark_func);
}